

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkGetAigNodeNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_2c;
  int local_20;
  int local_1c;
  int nNodes;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  local_20 = 0;
  iVar1 = Abc_NtkIsAigLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x116,"int Abc_NtkGetAigNodeNum(Abc_Ntk_t *)");
  }
  local_1c = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_1c) {
      return local_20;
    }
    pObj = Abc_NtkObj(pNtk,local_1c);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
      if ((pObj->field_5).pData == (void *)0x0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                      ,0x119,"int Abc_NtkGetAigNodeNum(Abc_Ntk_t *)");
      }
      iVar1 = Abc_ObjFaninNum(pObj);
      if (1 < iVar1) {
        if ((pObj->field_5).pData == (void *)0x0) {
          local_2c = 0;
        }
        else {
          local_2c = Hop_DagSize((Hop_Obj_t *)(pObj->field_5).pData);
        }
        local_20 = local_2c + local_20;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int Abc_NtkGetAigNodeNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, nNodes = 0;
    assert( Abc_NtkIsAigLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        if ( Abc_ObjFaninNum(pNode) < 2 )
            continue;
//printf( "%d ", Hop_DagSize( pNode->pData ) );
        nNodes += pNode->pData? Hop_DagSize( (Hop_Obj_t *)pNode->pData ) : 0;
    }
    return nNodes;
}